

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O0

Abc_ManRes_t * Abc_ManResubStart(int nLeavesMax,int nDivsMax)

{
  void *pvVar1;
  Abc_ManRes_t *__s;
  Vec_Ptr_t *pVVar2;
  uint *puVar3;
  int local_2c;
  int local_28;
  uint local_24;
  int k;
  int i;
  uint *pData;
  Abc_ManRes_t *p;
  int nDivsMax_local;
  int nLeavesMax_local;
  
  __s = (Abc_ManRes_t *)malloc(0x128);
  memset(__s,0,0x128);
  __s->nLeavesMax = nLeavesMax;
  __s->nDivsMax = nDivsMax;
  pVVar2 = Vec_PtrAlloc(__s->nDivsMax);
  __s->vDivs = pVVar2;
  __s->nBits = 1 << ((byte)__s->nLeavesMax & 0x1f);
  if (__s->nBits < 0x21) {
    local_2c = 1;
  }
  else {
    local_2c = __s->nBits / 0x20;
  }
  __s->nWords = local_2c;
  puVar3 = (uint *)malloc((long)(__s->nWords * (__s->nDivsMax + 1)) << 2);
  __s->pInfo = puVar3;
  memset(__s->pInfo,0,(long)__s->nWords * 4 * (long)__s->nLeavesMax);
  pVVar2 = Vec_PtrAlloc(__s->nDivsMax);
  __s->vSims = pVVar2;
  for (local_24 = 0; (int)local_24 < __s->nDivsMax; local_24 = local_24 + 1) {
    Vec_PtrPush(__s->vSims,__s->pInfo + (int)(local_24 * __s->nWords));
  }
  __s->pCareSet = __s->pInfo + __s->nDivsMax * __s->nWords;
  Abc_InfoFill(__s->pCareSet,__s->nWords);
  for (local_28 = 0; local_28 < __s->nLeavesMax; local_28 = local_28 + 1) {
    pvVar1 = __s->vSims->pArray[local_28];
    for (local_24 = 0; (int)local_24 < __s->nBits; local_24 = local_24 + 1) {
      if ((local_24 & 1 << ((byte)local_28 & 0x1f)) != 0) {
        *(uint *)((long)pvVar1 + (long)((int)local_24 >> 5) * 4) =
             1 << ((byte)local_24 & 0x1f) | *(uint *)((long)pvVar1 + (long)((int)local_24 >> 5) * 4)
        ;
      }
    }
  }
  pVVar2 = Vec_PtrAlloc(__s->nDivsMax);
  __s->vDivs1UP = pVVar2;
  pVVar2 = Vec_PtrAlloc(__s->nDivsMax);
  __s->vDivs1UN = pVVar2;
  pVVar2 = Vec_PtrAlloc(__s->nDivsMax);
  __s->vDivs1B = pVVar2;
  pVVar2 = Vec_PtrAlloc(__s->nDivsMax);
  __s->vDivs2UP0 = pVVar2;
  pVVar2 = Vec_PtrAlloc(__s->nDivsMax);
  __s->vDivs2UP1 = pVVar2;
  pVVar2 = Vec_PtrAlloc(__s->nDivsMax);
  __s->vDivs2UN0 = pVVar2;
  pVVar2 = Vec_PtrAlloc(__s->nDivsMax);
  __s->vDivs2UN1 = pVVar2;
  pVVar2 = Vec_PtrAlloc(__s->nDivsMax);
  __s->vTemp = pVVar2;
  return __s;
}

Assistant:

Abc_ManRes_t * Abc_ManResubStart( int nLeavesMax, int nDivsMax )
{
    Abc_ManRes_t * p;
    unsigned * pData;
    int i, k;
    assert( sizeof(unsigned) == 4 );
    p = ABC_ALLOC( Abc_ManRes_t, 1 );
    memset( p, 0, sizeof(Abc_ManRes_t) );
    p->nLeavesMax = nLeavesMax;
    p->nDivsMax   = nDivsMax;
    p->vDivs      = Vec_PtrAlloc( p->nDivsMax );
    // allocate simulation info
    p->nBits      = (1 << p->nLeavesMax);
    p->nWords     = (p->nBits <= 32)? 1 : (p->nBits / 32);
    p->pInfo      = ABC_ALLOC( unsigned, p->nWords * (p->nDivsMax + 1) );
    memset( p->pInfo, 0, sizeof(unsigned) * p->nWords * p->nLeavesMax );
    p->vSims      = Vec_PtrAlloc( p->nDivsMax );
    for ( i = 0; i < p->nDivsMax; i++ )
        Vec_PtrPush( p->vSims, p->pInfo + i * p->nWords );
    // assign the care set
    p->pCareSet  = p->pInfo + p->nDivsMax * p->nWords;
    Abc_InfoFill( p->pCareSet, p->nWords );
    // set elementary truth tables
    for ( k = 0; k < p->nLeavesMax; k++ )
    {
        pData = (unsigned *)p->vSims->pArray[k];
        for ( i = 0; i < p->nBits; i++ )
            if ( i & (1 << k) )
                pData[i>>5] |= (1 << (i&31));
    }
    // create the remaining divisors
    p->vDivs1UP  = Vec_PtrAlloc( p->nDivsMax );
    p->vDivs1UN  = Vec_PtrAlloc( p->nDivsMax );
    p->vDivs1B   = Vec_PtrAlloc( p->nDivsMax );
    p->vDivs2UP0 = Vec_PtrAlloc( p->nDivsMax );
    p->vDivs2UP1 = Vec_PtrAlloc( p->nDivsMax );
    p->vDivs2UN0 = Vec_PtrAlloc( p->nDivsMax );
    p->vDivs2UN1 = Vec_PtrAlloc( p->nDivsMax );
    p->vTemp     = Vec_PtrAlloc( p->nDivsMax );
    return p;
}